

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O3

int zueci_cp437_u(uchar *src,zueci_u32 len,uint flags,zueci_u32 *p_u)

{
  byte bVar1;
  uint uVar2;
  
  bVar1 = *src;
  uVar2 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    uVar2 = (uint)zueci_cp437_u_u
                  ["\x153#\x1d\x1e\x1b\x1f!$%\")(&\x12\x13\x16 \x14-.+204\x18\x19\x02\x03\x04C5\x1c\',1*\x17\x05\r\x11L\a\x10\x0f\x01\x06\x0e|}~PVkl`_m[agfeRSXWUOYhid^spjZvqrnocb\\]utTQyxz{w;\x1a6>8?\v@97:<FA=GI\tKJMN/H\bD\fEB\n\x7f"
                   [bVar1 - 0x80]];
  }
  *p_u = uVar2;
  return 1;
}

Assistant:

static int zueci_cp437_u(const unsigned char *src, const zueci_u32 len, const unsigned int flags, zueci_u32 *p_u) {
    const unsigned char c = *src;
    (void)len; (void)flags;
    if (c < 0x80) {
        *p_u = c;
        return 1;
    }
    *p_u = zueci_cp437_u_u[(int) zueci_cp437_sb_u[c - 0x80]]; /* No undefined */
    return 1;
}